

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O0

void anon_unknown.dwarf_1e3d60::testSingleView(void)

{
  ostream *this;
  reference pvVar1;
  iterator end;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> chans;
  string *in_stack_000002a0;
  undefined1 in_stack_000002af;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  *in_stack_000002b0;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  *in_stack_000002b8;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  *in_stack_ffffffffffffff08;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *this_00;
  allocator_type *in_stack_ffffffffffffff20;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> *this_01;
  size_type in_stack_ffffffffffffff28;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff40;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_a8 [32];
  MultiViewChannelName *local_88;
  MultiViewChannelName *local_80;
  MultiViewChannelName *local_78;
  MultiViewChannelName *local_70;
  allocator<char> local_61;
  string local_60 [32];
  MultiViewChannelName *local_40;
  MultiViewChannelName *local_38;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_> local_18;
  
  this = std::operator<<((ostream *)&std::cout,"testing with single view");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::allocator<Imf_3_2::MultiViewChannelName>::allocator
            ((allocator<Imf_3_2::MultiViewChannelName> *)0x205e0b);
  std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<Imf_3_2::MultiViewChannelName>::~allocator
            ((allocator<Imf_3_2::MultiViewChannelName> *)0x205e31);
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,0);
  std::__cxx11::string::operator=((string *)pvVar1,"R");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,1);
  std::__cxx11::string::operator=((string *)pvVar1,"G");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,2);
  std::__cxx11::string::operator=((string *)pvVar1,"B");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,3);
  std::__cxx11::string::operator=((string *)pvVar1,"A");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,4);
  std::__cxx11::string::operator=((string *)pvVar1,"bunny.foo");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,5);
  std::__cxx11::string::operator=((string *)pvVar1,"velocity.X");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,6);
  std::__cxx11::string::operator=((string *)pvVar1,"velocity.Y");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,7);
  std::__cxx11::string::operator=((string *)pvVar1,"foo.fred");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,8);
  std::__cxx11::string::operator=((string *)pvVar1,"Z");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,9);
  std::__cxx11::string::operator=((string *)pvVar1,"multiple.layers.in.name");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,10);
  std::__cxx11::string::operator=((string *)pvVar1,"multiple.layers.in.othername");
  pvVar1 = std::
           vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
           operator[](&local_18,0xb);
  std::__cxx11::string::operator=((string *)pvVar1,"foo.shiela");
  std::operator<<((ostream *)&std::cout," one part:\n");
  local_38 = (MultiViewChannelName *)
             std::
             vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
             begin(in_stack_ffffffffffffff08);
  local_40 = (MultiViewChannelName *)
             std::
             vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
             end(in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Imf_3_2::
  SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
            (in_stack_000002b8,in_stack_000002b0,(bool)in_stack_000002af,in_stack_000002a0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  this_01 = &local_18;
  local_70 = (MultiViewChannelName *)
             std::
             vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
             begin(in_stack_ffffffffffffff08);
  local_78 = (MultiViewChannelName *)
             std::
             vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
             end(in_stack_ffffffffffffff08);
  (anonymous_namespace)::
  print<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
            ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::operator<<((ostream *)&std::cout,"multi part:\n");
  local_80 = (MultiViewChannelName *)
             std::
             vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
             begin(in_stack_ffffffffffffff08);
  local_88 = (MultiViewChannelName *)
             std::
             vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
             end(in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  Imf_3_2::
  SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
            (in_stack_000002b8,in_stack_000002b0,(bool)in_stack_000002af,in_stack_000002a0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  this_00 = &local_18;
  end = std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
        begin(this_00);
  std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::end
            (this_00);
  (anonymous_namespace)::
  print<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
            ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
              *)end._M_current);
  std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
  ~vector(this_01);
  return;
}

Assistant:

void
testSingleView ()
{
    cout << "testing with single view" << endl;

    vector<MultiViewChannelName> chans (12);
    chans[0].name  = "R";
    chans[1].name  = "G";
    chans[2].name  = "B";
    chans[3].name  = "A";
    chans[4].name  = "bunny.foo";
    chans[5].name  = "velocity.X";
    chans[6].name  = "velocity.Y";
    chans[7].name  = "foo.fred";
    chans[8].name  = "Z";
    chans[9].name  = "multiple.layers.in.name";
    chans[10].name = "multiple.layers.in.othername";
    chans[11].name = "foo.shiela";

    cout << " one part:\n";
    SplitChannels (chans.begin (), chans.end (), false, "");

    print (chans.begin (), chans.end ());

    cout << "multi part:\n";

    SplitChannels (chans.begin (), chans.end (), true, "");

    print (chans.begin (), chans.end ());
}